

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hunk.cpp
# Opt level: O1

void __thiscall Hunk::replace(Hunk *this,int line,QString *subj,QString *repl)

{
  flushContext(this);
  HtmlDivs::append(&this->mSubj,subj,&this->mSubjBackgroundColor);
  HtmlDivs::append(&this->mRepl,repl,&this->mReplBackgroundColor);
  if (this->mLine < 0) {
    this->mLine = line;
  }
  this->mCount = this->mCount + 1;
  return;
}

Assistant:

void Hunk::replace(int line, const QString& subj, const QString& repl) {
    flushContext();
    mSubj.append(subj,mSubjBackgroundColor);
    mRepl.append(repl,mReplBackgroundColor);
    if (mLine < 0)
        mLine = line;
    mCount++;
}